

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::SerializeWithCachedSizesToArray
          (CodeGeneratorResponse_File *this,uint8 *target)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  uint8 *puVar4;
  
  uVar3 = this->_has_bits_[0];
  if ((uVar3 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar1 = this->name_;
    *target = '\n';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar4);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->insertion_point_->_M_dataplus)._M_p,
               (int)this->insertion_point_->_M_string_length,SERIALIZE);
    psVar1 = this->insertion_point_;
    *target = '\x12';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar4);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 4) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->content_->_M_dataplus)._M_p,(int)this->content_->_M_string_length,SERIALIZE);
    psVar1 = this->content_;
    *target = 'z';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar4);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorResponse_File::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string insertion_point = 2;
  if (has_insertion_point()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->insertion_point().data(), this->insertion_point().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->insertion_point(), target);
  }

  // optional string content = 15;
  if (has_content()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->content().data(), this->content().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        15, this->content(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}